

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildFile.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_194fe6::BuildFileImpl::parseNodesMapping(BuildFileImpl *this,MappingNode *map)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  KeyValueNode *pKVar4;
  Node *pNVar5;
  ScalarNode *pSVar6;
  MappingNode *this_00;
  MappingNode *pMVar7;
  undefined8 uVar8;
  Node *pNVar9;
  SequenceNode *this_01;
  ScalarNode *pSVar10;
  iterator __first;
  iterator __last;
  string local_4e8;
  undefined8 local_4c8;
  undefined8 local_4b8;
  undefined8 local_4b0;
  ConfigureContext local_4a8;
  StringRef local_480;
  allocator<llvm::StringRef> local_469;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_468;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_460;
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> local_458;
  ArrayRef<llvm::StringRef> local_440;
  undefined8 local_430;
  undefined8 local_428;
  ConfigureContext local_420;
  string local_3f8;
  StringRef local_3d8;
  ScalarNode *local_3c8;
  Node *node_1;
  iterator __end6;
  iterator __begin6;
  SequenceNode *__range6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  values_1;
  vector<std::pair<llvm::StringRef,_llvm::StringRef>,_std::allocator<std::pair<llvm::StringRef,_llvm::StringRef>_>_>
  local_378;
  undefined8 local_360;
  undefined8 local_358;
  undefined8 local_350;
  undefined8 local_348;
  ConfigureContext local_340;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_318;
  undefined1 local_2d8 [8];
  string value_1;
  string key_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  StringRef local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  StringRef local_208;
  KeyValueNode *local_1f8;
  KeyValueNode *entry_1;
  iterator __end5;
  iterator __begin5;
  MappingNode *__range5;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  values;
  string attribute;
  Node *value;
  Node *key;
  KeyValueNode *valueEntry;
  iterator __end3;
  iterator __begin3;
  MappingNode *__range3;
  undefined8 local_158;
  Node *node;
  MappingNode *attrs;
  string name;
  StringRef local_110;
  KeyValueNode *entry;
  iterator __end2;
  iterator __begin2;
  MappingNode *__range2;
  MappingNode *map_local;
  BuildFileImpl *this_local;
  
  __end2 = llvm::yaml::MappingNode::begin(map);
  entry = (KeyValueNode *)llvm::yaml::MappingNode::end(map);
  while (bVar1 = llvm::yaml::
                 basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
                 operator!=(&__end2,(basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>
                                     *)&entry), bVar1) {
    pKVar4 = llvm::yaml::
             basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::operator*
                       (&__end2);
    pNVar5 = llvm::yaml::KeyValueNode::getKey(pKVar4);
    uVar2 = llvm::yaml::Node::getType(pNVar5);
    if (uVar2 == 1) {
      pNVar5 = llvm::yaml::KeyValueNode::getValue(pKVar4);
      uVar2 = llvm::yaml::Node::getType(pNVar5);
      if (uVar2 == 4) {
        pSVar6 = (ScalarNode *)llvm::yaml::KeyValueNode::getKey(pKVar4);
        (anonymous_namespace)::BuildFileImpl::stringFromScalarNode_abi_cxx11_
                  ((string *)&attrs,this,pSVar6);
        this_00 = (MappingNode *)llvm::yaml::KeyValueNode::getValue(pKVar4);
        pMVar7 = (MappingNode *)std::__cxx11::string::data();
        __range3 = pMVar7;
        uVar8 = std::__cxx11::string::length();
        local_158 = uVar8;
        pNVar9 = getOrCreateNode(this,___range3,false);
        __end3 = llvm::yaml::MappingNode::begin(this_00);
        valueEntry = (KeyValueNode *)llvm::yaml::MappingNode::end(this_00);
        while (bVar1 = llvm::yaml::
                       basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>
                       ::operator!=(&__end3,(basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>
                                             *)&valueEntry), bVar1) {
          pKVar4 = llvm::yaml::
                   basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
                   operator*(&__end3);
          pSVar6 = (ScalarNode *)llvm::yaml::KeyValueNode::getKey(pKVar4);
          this_01 = (SequenceNode *)llvm::yaml::KeyValueNode::getValue(pKVar4);
          uVar2 = llvm::yaml::Node::getType((Node *)pSVar6);
          if (uVar2 == 1) {
            (anonymous_namespace)::BuildFileImpl::stringFromScalarNode_abi_cxx11_
                      ((string *)
                       &values.
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,this,pSVar6);
            uVar2 = llvm::yaml::Node::getType((Node *)this_01);
            if (uVar2 == 4) {
              std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&__range5);
              __end5 = llvm::yaml::MappingNode::begin((MappingNode *)this_01);
              entry_1 = (KeyValueNode *)llvm::yaml::MappingNode::end((MappingNode *)this_01);
              while (bVar1 = llvm::yaml::
                             basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>
                             ::operator!=(&__end5,(
                                                  basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>
                                                  *)&entry_1), bVar1) {
                local_1f8 = llvm::yaml::
                            basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>
                            ::operator*(&__end5);
                pNVar5 = llvm::yaml::KeyValueNode::getKey(local_1f8);
                uVar2 = llvm::yaml::Node::getType(pNVar5);
                if (uVar2 == 1) {
                  pNVar5 = llvm::yaml::KeyValueNode::getValue(local_1f8);
                  uVar2 = llvm::yaml::Node::getType(pNVar5);
                  if (uVar2 == 1) {
                    pSVar10 = (ScalarNode *)llvm::yaml::KeyValueNode::getKey(local_1f8);
                    (anonymous_namespace)::BuildFileImpl::stringFromScalarNode_abi_cxx11_
                              ((string *)((long)&value_1.field_2 + 8),this,pSVar10);
                    pSVar10 = (ScalarNode *)llvm::yaml::KeyValueNode::getValue(local_1f8);
                    (anonymous_namespace)::BuildFileImpl::stringFromScalarNode_abi_cxx11_
                              ((string *)local_2d8,this,pSVar10);
                    std::make_pair<std::__cxx11::string&,std::__cxx11::string&>
                              (&local_318,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)&value_1.field_2 + 8),
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_2d8);
                    std::
                    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::push_back((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&__range5,&local_318);
                    std::
                    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::~pair(&local_318);
                    std::__cxx11::string::~string((string *)local_2d8);
                    std::__cxx11::string::~string((string *)(value_1.field_2._M_local_buf + 8));
                  }
                  else {
                    pNVar5 = llvm::yaml::KeyValueNode::getKey(local_1f8);
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)((long)&key_1.field_2 + 8),"invalid value type for \'",
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&values.
                                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
                    std::operator+(&local_278,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)((long)&key_1.field_2 + 8),"\' in \'nodes\' map");
                    uVar8 = std::__cxx11::string::data();
                    local_258.Data = (char *)uVar8;
                    uVar8 = std::__cxx11::string::length();
                    local_258.Length = uVar8;
                    error(this,pNVar5,local_258);
                    std::__cxx11::string::~string((string *)&local_278);
                    std::__cxx11::string::~string((string *)(key_1.field_2._M_local_buf + 8));
                  }
                }
                else {
                  pNVar5 = llvm::yaml::KeyValueNode::getKey(local_1f8);
                  std::operator+(&local_248,"invalid key type for \'",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&values.
                                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  std::operator+(&local_228,&local_248,"\' in \'nodes\' map");
                  uVar8 = std::__cxx11::string::data();
                  local_208.Data = (char *)uVar8;
                  uVar8 = std::__cxx11::string::length();
                  local_208.Length = uVar8;
                  error(this,pNVar5,local_208);
                  std::__cxx11::string::~string((string *)&local_228);
                  std::__cxx11::string::~string((string *)&local_248);
                }
                llvm::yaml::
                basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
                operator++(&__end5);
              }
              getContext(&local_340,this,(Node *)pSVar6);
              local_350 = std::__cxx11::string::data();
              local_348 = std::__cxx11::string::length();
              __first = std::
                        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&__range5);
              __last = std::
                       vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&__range5);
              std::allocator<std::pair<llvm::StringRef,_llvm::StringRef>_>::allocator
                        ((allocator<std::pair<llvm::StringRef,_llvm::StringRef>_> *)
                         ((long)&values_1.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
              std::
              vector<std::pair<llvm::StringRef,llvm::StringRef>,std::allocator<std::pair<llvm::StringRef,llvm::StringRef>>>
              ::
              vector<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,std::__cxx11::string>*,std::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>>,void>
                        ((vector<std::pair<llvm::StringRef,llvm::StringRef>,std::allocator<std::pair<llvm::StringRef,llvm::StringRef>>>
                          *)&local_378,
                         (__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          )__first._M_current,
                         (__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          )__last._M_current,
                         (allocator_type *)
                         ((long)&values_1.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
              llvm::ArrayRef<std::pair<llvm::StringRef,llvm::StringRef>>::
              ArrayRef<std::allocator<std::pair<llvm::StringRef,llvm::StringRef>>>
                        ((ArrayRef<std::pair<llvm::StringRef,llvm::StringRef>> *)&local_360,
                         &local_378);
              iVar3 = (*pNVar9->_vptr_Node[4])
                                (pNVar9,&local_340,local_350,local_348,local_360,local_358);
              std::
              vector<std::pair<llvm::StringRef,_llvm::StringRef>,_std::allocator<std::pair<llvm::StringRef,_llvm::StringRef>_>_>
              ::~vector(&local_378);
              std::allocator<std::pair<llvm::StringRef,_llvm::StringRef>_>::~allocator
                        ((allocator<std::pair<llvm::StringRef,_llvm::StringRef>_> *)
                         ((long)&values_1.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
              values_1.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ =
                   (((byte)iVar3 ^ 0xff) & 1) != 0;
              if (values_1.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_) {
                this_local._7_1_ = 0;
              }
              values_1.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._1_3_ = 0;
              std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&__range5);
joined_r0x001ecf45:
              if ((uint)values_1.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage == 0) {
LAB_001ed14b:
                values_1.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
              }
            }
            else {
              uVar2 = llvm::yaml::Node::getType((Node *)this_01);
              if (uVar2 == 5) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&__range6);
                __end6 = llvm::yaml::SequenceNode::begin(this_01);
                node_1 = (Node *)llvm::yaml::SequenceNode::end(this_01);
                while (bVar1 = llvm::yaml::
                               basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>
                               ::operator!=(&__end6,(
                                                  basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>
                                                  *)&node_1), bVar1) {
                  local_3c8 = (ScalarNode *)
                              llvm::yaml::
                              basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>
                              ::operator*(&__end6);
                  uVar2 = llvm::yaml::Node::getType((Node *)local_3c8);
                  pSVar10 = local_3c8;
                  if (uVar2 == 1) {
                    (anonymous_namespace)::BuildFileImpl::stringFromScalarNode_abi_cxx11_
                              (&local_3f8,this,local_3c8);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&__range6,&local_3f8);
                    std::__cxx11::string::~string((string *)&local_3f8);
                  }
                  else {
                    strlen("invalid value type for node in \'nodes\' map");
                    error(this,&pSVar10->super_Node,local_3d8);
                  }
                  llvm::yaml::basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>
                  ::operator++(&__end6);
                }
                getContext(&local_420,this,(Node *)pSVar6);
                local_430 = std::__cxx11::string::data();
                local_428 = std::__cxx11::string::length();
                local_460._M_current =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&__range6);
                local_468._M_current =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&__range6);
                std::allocator<llvm::StringRef>::allocator(&local_469);
                std::vector<llvm::StringRef,std::allocator<llvm::StringRef>>::
                vector<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                          ((vector<llvm::StringRef,std::allocator<llvm::StringRef>> *)&local_458,
                           local_460,local_468,&local_469);
                llvm::ArrayRef<llvm::StringRef>::ArrayRef<std::allocator<llvm::StringRef>>
                          (&local_440,&local_458);
                iVar3 = (*pNVar9->_vptr_Node[3])
                                  (pNVar9,&local_420,local_430,local_428,local_440.Data,
                                   local_440.Length);
                std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::~vector(&local_458);
                std::allocator<llvm::StringRef>::~allocator(&local_469);
                values_1.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ =
                     (((byte)iVar3 ^ 0xff) & 1) != 0;
                if (values_1.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_) {
                  this_local._7_1_ = 0;
                }
                values_1.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._1_3_ = 0;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&__range6);
                goto joined_r0x001ecf45;
              }
              uVar2 = llvm::yaml::Node::getType((Node *)this_01);
              if (uVar2 == 1) {
                getContext(&local_4a8,this,(Node *)pSVar6);
                local_4b8 = std::__cxx11::string::data();
                local_4b0 = std::__cxx11::string::length();
                (anonymous_namespace)::BuildFileImpl::stringFromScalarNode_abi_cxx11_
                          (&local_4e8,this,(ScalarNode *)this_01);
                local_4c8 = std::__cxx11::string::data();
                uVar8 = std::__cxx11::string::length();
                iVar3 = (*pNVar9->_vptr_Node[2])
                                  (pNVar9,&local_4a8,local_4b8,local_4b0,local_4c8,uVar8);
                std::__cxx11::string::~string((string *)&local_4e8);
                if ((((byte)iVar3 ^ 0xff) & 1) != 0) {
                  this_local._7_1_ = 0;
                  values_1.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
                  goto LAB_001ed155;
                }
                goto LAB_001ed14b;
              }
              strlen("invalid value type for node in \'nodes\' map");
              error(this,(Node *)this_01,local_480);
              values_1.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 5;
            }
LAB_001ed155:
            std::__cxx11::string::~string
                      ((string *)
                       &values.
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            if (((uint)values_1.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage != 0) &&
               ((uint)values_1.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage != 5)) goto LAB_001ed19d;
          }
          else {
            strlen("invalid key type for node in \'nodes\' map");
            error(this,(Node *)pSVar6,stack0xfffffffffffffe60);
          }
          llvm::yaml::basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
          operator++(&__end3);
        }
        values_1.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
LAB_001ed19d:
        std::__cxx11::string::~string((string *)&attrs);
        if ((uint)values_1.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage != 0) goto LAB_001ed1d1;
      }
      else {
        pNVar5 = llvm::yaml::KeyValueNode::getValue(pKVar4);
        strlen("invalid value type in \'nodes\' map");
        error(this,pNVar5,stack0xfffffffffffffee0);
      }
    }
    else {
      pNVar5 = llvm::yaml::KeyValueNode::getKey(pKVar4);
      strlen("invalid key type in \'nodes\' map");
      error(this,pNVar5,local_110);
    }
    llvm::yaml::basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
    operator++(&__end2);
  }
  this_local._7_1_ = 1;
LAB_001ed1d1:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool parseNodesMapping(llvm::yaml::MappingNode* map) {
    for (auto& entry: *map) {
      // Every key must be scalar.
      if (entry.getKey()->getType() != llvm::yaml::Node::NK_Scalar) {
        error(entry.getKey(), "invalid key type in 'nodes' map");
        continue;
      }
      // Every value must be a mapping.
      if (entry.getValue()->getType() != llvm::yaml::Node::NK_Mapping) {
        error(entry.getValue(), "invalid value type in 'nodes' map");
        continue;
      }

      std::string name = stringFromScalarNode(
          static_cast<llvm::yaml::ScalarNode*>(entry.getKey()));
      llvm::yaml::MappingNode* attrs = static_cast<llvm::yaml::MappingNode*>(
          entry.getValue());

      // Get the node.
      //
      // FIXME: One downside of doing the lookup here is that the client cannot
      // ever make a context dependent node that can have configured properties.
      auto node = getOrCreateNode(name, /*isImplicit=*/false);

      // Configure all of the tool attributes.
      for (auto& valueEntry: *attrs) {
        auto key = valueEntry.getKey();
        auto value = valueEntry.getValue();
        
        // All keys must be scalar.
        if (key->getType() != llvm::yaml::Node::NK_Scalar) {
          error(key, "invalid key type for node in 'nodes' map");
          continue;
        }

        auto attribute = stringFromScalarNode(
            static_cast<llvm::yaml::ScalarNode*>(key));

        if (value->getType() == llvm::yaml::Node::NK_Mapping) {
          std::vector<std::pair<std::string, std::string>> values;
          for (auto& entry: *static_cast<llvm::yaml::MappingNode*>(value)) {
            // Every key must be scalar.
            if (entry.getKey()->getType() != llvm::yaml::Node::NK_Scalar) {
              error(entry.getKey(), ("invalid key type for '" + attribute +
                                     "' in 'nodes' map"));
              continue;
            }
            // Every value must be scalar.
            if (entry.getValue()->getType() != llvm::yaml::Node::NK_Scalar) {
              error(entry.getKey(), ("invalid value type for '" + attribute +
                                     "' in 'nodes' map"));
              continue;
            }

            std::string key = stringFromScalarNode(
                static_cast<llvm::yaml::ScalarNode*>(entry.getKey()));
            std::string value = stringFromScalarNode(
                static_cast<llvm::yaml::ScalarNode*>(entry.getValue()));
            values.push_back(std::make_pair(key, value));
          }

          if (!node->configureAttribute(
                  getContext(key), attribute,
                  std::vector<std::pair<StringRef, StringRef>>(
                      values.begin(), values.end()))) {
            return false;
          }
        } else if (value->getType() == llvm::yaml::Node::NK_Sequence) {
          std::vector<std::string> values;
          for (auto& node: *static_cast<llvm::yaml::SequenceNode*>(value)) {
            if (node.getType() != llvm::yaml::Node::NK_Scalar) {
              error(&node, "invalid value type for node in 'nodes' map");
              continue;
            }
            values.push_back(
                stringFromScalarNode(
                    static_cast<llvm::yaml::ScalarNode*>(&node)));
          }

          if (!node->configureAttribute(
                  getContext(key), attribute,
                  std::vector<StringRef>(values.begin(), values.end()))) {
            return false;
          }
        } else {
          if (value->getType() != llvm::yaml::Node::NK_Scalar) {
            error(value, "invalid value type for node in 'nodes' map");
            continue;
          }
        
          if (!node->configureAttribute(
                  getContext(key), attribute,
                  stringFromScalarNode(
                      static_cast<llvm::yaml::ScalarNode*>(value)))) {
            return false;
          }
        }
      }
    }

    return true;
  }